

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

void __thiscall TypeFactory::clearCache(TypeFactory *this)

{
  Datatype *(*papDVar1) [8];
  long lVar2;
  long lVar3;
  
  papDVar1 = this->typecache;
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      (*papDVar1)[lVar3] = (Datatype *)0x0;
    }
    papDVar1 = papDVar1 + 1;
  }
  this->typecache10 = (Datatype *)0x0;
  this->typecache16 = (Datatype *)0x0;
  this->type_nochar = (Datatype *)0x0;
  return;
}

Assistant:

void TypeFactory::clearCache(void)

{
  int4 i,j;
  for(i=0;i<9;++i)
    for(j=0;j<8;++j)
      typecache[i][j] = (Datatype *)0;
  typecache10 = (Datatype *)0;
  typecache16 = (Datatype *)0;
  type_nochar = (Datatype *)0;
}